

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O2

bool __thiscall blc::tools::pipe::push_out(pipe *this,string *target,string *str,mutex *locker)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  
  if ((locker != (mutex *)0x0 && target != (string *)0x0) &&
     (iVar2 = (*(this->super_stream)._vptr_stream[6])(), (char)iVar2 == '\0')) {
    if (this->_block == false) {
      bVar1 = std::mutex::try_lock(locker);
      if (!bVar1) {
        return false;
      }
    }
    else {
      std::mutex::lock(locker);
    }
    str->_M_string_length = 0;
    *(str->_M_dataplus)._M_p = '\0';
    iVar2 = 1;
    while ((uVar3 = (ulong)(iVar2 - 1), uVar3 < target->_M_string_length &&
           ((target->_M_dataplus)._M_p[uVar3] != '\n'))) {
      std::__cxx11::string::resize((ulong)str);
      (str->_M_dataplus)._M_p[uVar3] = (target->_M_dataplus)._M_p[uVar3];
      iVar2 = iVar2 + 1;
    }
    std::__cxx11::string::erase((ulong)target,0);
    pthread_mutex_unlock((pthread_mutex_t *)locker);
    return true;
  }
  return false;
}

Assistant:

bool blc::tools::pipe::push_out(std::string *target, std::string *str, std::mutex *locker) const {
	unsigned int i;

	if (target == nullptr || locker == nullptr)
		return (false);
	if (this->isClosed())
		return (false);
	if (this->_block == false) {
		if (locker->try_lock() == false)
			return (false);
	} else {
		locker->lock();
	}
	(*str).clear();
	for (i = 0; target->size() > i; i++) {
		if ((*target)[i] == '\n')
			break;
		(*str).resize((*str).size() + 1);
		(*str)[i] = (*target)[i];
	}
	target->erase(0, i + 1);
	locker->unlock();
	return (true);
}